

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_setting_fx_swap_stream_with_Tenor_and_settlement_Test::
SubjectFactoryTest_test_setting_fx_swap_stream_with_Tenor_and_settlement_Test
          (SubjectFactoryTest_test_setting_fx_swap_stream_with_Tenor_and_settlement_Test *this)

{
  SubjectFactoryTest_test_setting_fx_swap_stream_with_Tenor_and_settlement_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__SubjectFactoryTest_test_setting_fx_swap_stream_with_Tenor_and_settlement_Test_003d40e8;
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_fx_swap_stream_with_Tenor_and_settlement)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=Swap,FarCurrency=EUR,FarQuantity=3500000.00,FarSettlementDate=20181223,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=3500000.00,RequestFor=Stream,SettlementDate=20180915,Symbol=EURGBP,Tenor=3W,User=fbennett",
            subject_factory.Fx().Stream().Swap()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("EURGBP")
                    .Currency("EUR")
                    .NearQuantity(3500000)
                    .NearSettlementDate(new Date(2018, 9, 15))
                    .NearTenor(Tenor::IN_3_WEEKS)
                    .FarQuantity(3500000)
                    .FarSettlementDate(new Date(2018, 12, 23))
                    .FarTenor(Tenor::IN_3_MONTHS)
                    .CreateSubject()
                    .ToString().c_str());
}